

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O2

void __thiscall OpenMD::DumpReader::parseSiteLine(DumpReader *this,string *line)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int index;
  StuntDouble *this_00;
  long *plVar5;
  Atom *pAVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  RealType RVar10;
  int siteIndex;
  DumpReader *local_268;
  string type;
  Vector3d eField;
  string indexTest;
  StringTokenizer tokenizer;
  istringstream i;
  
  local_268 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i," ;\t\n\r",(allocator<char> *)&indexTest);
  StringTokenizer::StringTokenizer(&tokenizer,line,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  iVar4 = StringTokenizer::countTokens(&tokenizer);
  if (iVar4 < 1) {
    snprintf(painCave.errMsg,2000,"DumpReader Error: Not enough Tokens.\n%s\n",
             (line->_M_dataplus)._M_p);
    painCave.isFatal = 1;
    simError();
  }
  index = StringTokenizer::nextTokenAsInt(&tokenizer);
  this_00 = SimInfo::getIOIndexToIntegrableObject(local_268->info_,index);
  if (iVar4 == 1 || this_00 == (StuntDouble *)0x0) goto LAB_0013a7e5;
  StringTokenizer::peekNextToken_abi_cxx11_(&indexTest,&tokenizer);
  std::__cxx11::istringstream::istringstream((istringstream *)&i,(string *)&indexTest,_S_in);
  plVar5 = (long *)std::istream::operator>>(&i,&siteIndex);
  if (((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) &&
     (siteIndex = StringTokenizer::nextTokenAsInt(&tokenizer), this_00->objType_ == otRigidBody)) {
    if (siteIndex <
        (int)((ulong)((long)this_00[2].properties_._vptr_PropertyMap - (long)this_00[2].mass_) >> 3)
       ) {
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&type,
                 (vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&this_00[2].mass_);
      this_00 = *(StuntDouble **)(type._M_dataplus._M_p + (long)siteIndex * 8);
      std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base
                ((_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&type);
      goto LAB_0013a543;
    }
  }
  else {
LAB_0013a543:
    StringTokenizer::nextToken_abi_cxx11_(&type,&tokenizer);
    uVar2 = (uint)type._M_string_length;
    if ((int)(uint)type._M_string_length < 1) {
      uVar2 = 0;
    }
    for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
      cVar1 = type._M_dataplus._M_p[uVar9];
      switch(cVar1) {
      case 'c':
        RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        if (this_00->objType_ < otRigidBody) {
          pAVar6 = (Atom *)__dynamic_cast(this_00,&StuntDouble::typeinfo,&Atom::typeinfo,0);
          bVar3 = Atom::isFluctuatingCharge(pAVar6);
          if (bVar3) {
            lVar8 = (long)this_00->localIndex_;
            lVar7 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).flucQPos.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start + this_00->storage_);
            goto LAB_0013a7b7;
          }
        }
        break;
      case 'd':
        RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        lVar8 = (long)this_00->localIndex_;
        lVar7 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).density.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start + this_00->storage_);
        goto LAB_0013a7b7;
      case 'e':
        Vector<double,_3U>::Vector(&eField.super_Vector<double,_3U>);
        eField.super_Vector<double,_3U>.data_[0] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        eField.super_Vector<double,_3U>.data_[1] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        eField.super_Vector<double,_3U>.data_[2] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        if (local_268->readField_ == true) {
          StuntDouble::setElectricField(this_00,&eField);
        }
        break;
      case 'f':
switchD_0013a596_caseD_66:
        snprintf(painCave.errMsg,2000,"DumpReader Error: %s is an unrecognized type\n");
        painCave.isFatal = 1;
        simError();
        break;
      case 'g':
        RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        if (this_00->objType_ < otRigidBody) {
          pAVar6 = (Atom *)__dynamic_cast(this_00,&StuntDouble::typeinfo,&Atom::typeinfo,0);
          bVar3 = Atom::isFluctuatingCharge(pAVar6);
          if (bVar3) {
            lVar8 = (long)this_00->localIndex_;
            lVar7 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).flucQFrc.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start + this_00->storage_);
            goto LAB_0013a7b7;
          }
        }
        break;
      default:
        if (cVar1 == 's') {
          RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          lVar8 = (long)this_00->localIndex_;
          lVar7 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).sitePotential
                                   .super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start + this_00->storage_);
        }
        else {
          if (cVar1 != 'u') {
            if (cVar1 != 'w') goto switchD_0013a596_caseD_66;
            RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
            if (this_00->objType_ < otRigidBody) {
              pAVar6 = (Atom *)__dynamic_cast(this_00,&StuntDouble::typeinfo,&Atom::typeinfo,0);
              bVar3 = Atom::isFluctuatingCharge(pAVar6);
              if (bVar3) {
                lVar8 = (long)this_00->localIndex_;
                lVar7 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).
                                         flucQVel.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start + this_00->storage_);
                goto LAB_0013a7b7;
              }
            }
            break;
          }
          RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          lVar8 = (long)this_00->localIndex_;
          lVar7 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).particlePot.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start + this_00->storage_);
        }
LAB_0013a7b7:
        *(RealType *)(lVar7 + lVar8 * 8) = RVar10;
      }
    }
    std::__cxx11::string::~string((string *)&type);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&i);
  std::__cxx11::string::~string((string *)&indexTest);
LAB_0013a7e5:
  StringTokenizer::~StringTokenizer(&tokenizer);
  return;
}

Assistant:

void DumpReader::parseSiteLine(const std::string& line) {
    StringTokenizer tokenizer(line);
    int nTokens;

    nTokens = tokenizer.countTokens();

    if (nTokens < 1) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpReader Error: Not enough Tokens.\n%s\n", line.c_str());
      painCave.isFatal = 1;
      simError();
    }

    /**
     * The first token is the global integrable object index.
     */

    int index       = tokenizer.nextTokenAsInt();
    StuntDouble* sd = info_->getIOIndexToIntegrableObject(index);
    if (sd == NULL) { return; }

    // StuntDoubles have a line even if there is nothing stored in the
    // site data:
    if (nTokens == 1) { return; }

    /**
     * Test to see if the next token is an integer or not.  If not,
     * we've got data on the integrable object itself.  If there is an
     * integer, we're parsing data for a site on a rigid body.
     */
    std::string indexTest = tokenizer.peekNextToken();
    std::istringstream i(indexTest);
    int siteIndex;
    if (i >> siteIndex) {
      // chew up this token and parse as an int:
      siteIndex = tokenizer.nextTokenAsInt();
      if (sd->isRigidBody()) {
        RigidBody* rb = static_cast<RigidBody*>(sd);

        // Sometimes site lines are inherited from other models, so
        // just ignore a site line that exceeds the number of atoms in
        // our RB:
        if (siteIndex >= static_cast<int>(rb->getNumAtoms())) { return; }

        sd = rb->getAtoms()[siteIndex];
      }
    }

    /**
     * The next token contains information on what follows.
     */
    std::string type = tokenizer.nextToken();
    int size         = type.size();

    for (int i = 0; i < size; ++i) {
      switch (type[i]) {
      case 'u': {
        RealType particlePot;
        particlePot = tokenizer.nextTokenAsDouble();
        sd->setParticlePot(particlePot);
        break;
      }
      case 'c': {
        RealType flucQPos;
        flucQPos = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQPos(flucQPos);
        break;
      }
      case 'w': {
        RealType flucQVel;
        flucQVel = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQVel(flucQVel);
        break;
      }
      case 'g': {
        RealType flucQFrc;
        flucQFrc = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQFrc(flucQFrc);
        break;
      }
      case 'e': {
        Vector3d eField;
        eField[0] = tokenizer.nextTokenAsDouble();
        eField[1] = tokenizer.nextTokenAsDouble();
        eField[2] = tokenizer.nextTokenAsDouble();
        if (readField_) sd->setElectricField(eField);
        break;
      }
      case 's': {
        RealType sPot;
        sPot = tokenizer.nextTokenAsDouble();
        sd->setSitePotential(sPot);
        break;
      }
      case 'd': {
        RealType dens;
        dens = tokenizer.nextTokenAsDouble();
        sd->setDensity(dens);
        break;
      }
      default: {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpReader Error: %s is an unrecognized type\n",
                 type.c_str());
        painCave.isFatal = 1;
        simError();
        break;
      }
      }
    }
  }